

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *worldAabbMin,
          cbtVector3 *worldAabbMax,unsigned_short handleMask,unsigned_short handleSentinel,
          unsigned_short userMaxHandles,cbtOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  Edge *pEVar1;
  undefined8 uVar2;
  cbtHashedOverlappingPairCache *this_00;
  cbtOverlappingPairCache *pcVar3;
  cbtDbvtBroadphase *this_01;
  Handle *pHVar4;
  void *pvVar5;
  long lVar6;
  ushort uVar7;
  short sVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [12];
  undefined1 in_ZMM3 [64];
  
  auVar14 = in_ZMM3._4_12_;
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtAxisSweep3Internal_00b6f178;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (cbtOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (cbtDbvtBroadphase *)0x0;
  uVar7 = userMaxHandles + 1;
  if (pairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  if (!disableRaycastAccelerator) {
    pcVar3 = (cbtOverlappingPairCache *)cbtAlignedAllocInternal(0x28,0x10);
    (pcVar3->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar3[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar3[2].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar3[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar3[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    (pcVar3->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback =
         (_func_int **)&PTR__cbtNullPairCache_00b6f1f8;
    *(undefined1 *)&pcVar3[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = 1;
    pcVar3[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    *(undefined8 *)
     ((long)&pcVar3[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pcVar3;
    this_01 = (cbtDbvtBroadphase *)cbtAlignedAllocInternal(0x100,0x10);
    cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar2 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar2;
  fVar13 = (float)this->m_handleSentinel;
  auVar10._0_4_ = fVar13 / ((this->m_worldAabbMax).m_floats[0] - (this->m_worldAabbMin).m_floats[0])
  ;
  auVar10._4_12_ = auVar14;
  auVar11._0_4_ = fVar13 / ((this->m_worldAabbMax).m_floats[1] - (this->m_worldAabbMin).m_floats[1])
  ;
  auVar11._4_12_ = auVar14;
  auVar10 = vinsertps_avx(auVar10,auVar11,0x10);
  auVar12._0_4_ = fVar13 / ((this->m_worldAabbMax).m_floats[2] - (this->m_worldAabbMin).m_floats[2])
  ;
  auVar12._4_12_ = auVar14;
  auVar10 = vinsertps_avx(auVar10,auVar12,0x28);
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar10;
  uVar9 = (uint)uVar7;
  pHVar4 = (Handle *)cbtAlignedAllocInternal((ulong)(uVar9 * 8) * 9,0x10);
  if (uVar7 != 0) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)(pHVar4->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar6 + -0x14) =
           0;
      lVar6 = lVar6 + 0x48;
    } while ((ulong)(uVar9 * 8) * 9 != lVar6);
  }
  this->m_pHandles = pHVar4;
  this->m_maxHandles = uVar7;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 1;
  if (1 < uVar7) {
    sVar8 = 2;
    lVar6 = 0;
    do {
      *(short *)((long)(&pHVar4[1].super_cbtBroadphaseProxy.m_aabbMax + 1) + lVar6) = sVar8;
      lVar6 = lVar6 + 0x48;
      sVar8 = sVar8 + 1;
    } while ((ulong)uVar9 * 0x48 + -0x48 != lVar6);
  }
  *(undefined2 *)&pHVar4[(ulong)uVar9 - 1].super_cbtBroadphaseProxy.field_0x34 = 0;
  lVar6 = -3;
  do {
    pvVar5 = cbtAlignedAllocInternal((ulong)(uVar9 * 8),0x10);
    this->m_pEdgesRawPtr[lVar6 + 3] = pvVar5;
    this->m_pEdgesRawPtr[lVar6] = pvVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  pHVar4 = this->m_pHandles;
  (pHVar4->super_cbtBroadphaseProxy).m_clientObject = (void *)0x0;
  lVar6 = 0;
  do {
    pHVar4->m_maxEdges[lVar6 + -3] = 0;
    pHVar4->m_maxEdges[lVar6] = 1;
    pEVar1 = this->m_pEdges[lVar6];
    pEVar1->m_pos = 0;
    pEVar1->m_handle = 0;
    pEVar1[1].m_pos = this->m_handleSentinel;
    pEVar1[1].m_handle = 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::cbtAxisSweep3Internal(const cbtVector3& worldAabbMin, const cbtVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel, BP_FP_INT_TYPE userMaxHandles, cbtOverlappingPairCache* pairCache, bool disableRaycastAccelerator)
	: m_bpHandleMask(handleMask),
	  m_handleSentinel(handleSentinel),
	  m_pairCache(pairCache),
	  m_userPairCallback(0),
	  m_ownsPairCache(false),
	  m_invalidPair(0),
	  m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles + 1);  //need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (ptr) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (cbtAlignedAlloc(sizeof(cbtNullPairCache), 16)) cbtNullPairCache();
		m_raycastAccelerator = new (cbtAlignedAlloc(sizeof(cbtDbvtBroadphase), 16)) cbtDbvtBroadphase(m_nullPairCache);  //m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;                                                                //don't add/remove pairs
	}

	//cbtAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	cbtVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE maxInt = m_handleSentinel;

	m_quantize = cbtVector3(cbtScalar(maxInt), cbtScalar(maxInt), cbtScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using cbtAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];

	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = cbtAlignedAlloc(sizeof(Edge) * maxHandles * 2, 16);
			m_pEdges[i] = new (m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels

	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
	}
}